

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSparseResourcesBufferSparseBinding.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::sparse::anon_unknown_3::BufferSparseBindingInstance::iterate
          (TestStatus *__return_storage_ptr__,BufferSparseBindingInstance *this)

{
  VkAllocationCallbacks **this_00;
  VkCommandBuffer_s *pVVar1;
  deUint64 dVar2;
  VkQueue pVVar3;
  VkCommandBuffer commandBuffer_00;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> data_00;
  Deleter<vk::Handle<(vk::HandleType)7>_> deleter;
  RefData<vk::Handle<(vk::HandleType)8>_> data_01;
  RefData<vk::Handle<(vk::HandleType)4>_> data_02;
  RefData<vk::Handle<(vk::HandleType)24>_> data_03;
  RefData<vk::VkCommandBuffer_s_*> data_04;
  RefData<vk::Handle<(vk::HandleType)8>_> data_05;
  RefData<vk::Handle<(vk::HandleType)8>_> data_06;
  bool bVar4;
  uint bindCount;
  undefined1 auVar5 [8];
  VkResult result;
  int iVar6;
  MovePtr *vk;
  Queue *pQVar7;
  Queue *pQVar8;
  VkDevice pVVar9;
  Handle<(vk::HandleType)8> *pHVar10;
  NotSupportedError *pNVar11;
  Checked<vk::Handle<(vk::HandleType)7>_> object;
  reference pBinds;
  Handle<(vk::HandleType)24> *pHVar12;
  VkCommandBuffer_s **ppVVar13;
  Allocator *pAVar14;
  reference pvVar15;
  Allocation *pAVar16;
  void *dst;
  VkDeviceSize VVar17;
  Handle<(vk::HandleType)4> *pWaitSemaphores;
  ulong uVar18;
  MovePtr *pMVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  allocator<char> local_b31;
  string local_b30;
  allocator<char> local_b09;
  string local_b08;
  void *local_ae8;
  deUint8 *outputData;
  VkPipelineStageFlags local_ad4;
  VkBuffer VStack_ad0;
  VkPipelineStageFlags waitStageBits [1];
  undefined1 local_ac8 [8];
  VkBufferMemoryBarrier outputBufferBarrier;
  undefined1 local_a80 [8];
  VkBufferCopy bufferCopy_1;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_a58;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_a48;
  undefined1 local_a38 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> outputBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_a08;
  undefined1 local_9e8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> outputBuffer;
  VkBufferCreateInfo outputBufferCreateInfo;
  undefined1 local_988 [8];
  VkBufferMemoryBarrier sparseBufferBarrier;
  undefined1 local_940 [8];
  VkBufferCopy bufferCopy;
  undefined1 local_920 [8];
  VkBufferMemoryBarrier inputBufferBarrier;
  uint local_8dc;
  undefined1 local_8d8 [4];
  deUint32 valueNdx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> referenceData;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> local_8b0;
  PtrData<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *local_8a0;
  undefined1 local_890 [8];
  UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> inputBufferAlloc;
  RefData<vk::Handle<(vk::HandleType)8>_> local_860;
  undefined1 local_840 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> inputBuffer;
  VkBufferCreateInfo inputBufferCreateInfo;
  Move<vk::VkCommandBuffer_s_*> local_7e0;
  RefData<vk::VkCommandBuffer_s_*> local_7c0;
  undefined1 local_7a0 [8];
  Unique<vk::VkCommandBuffer_s_*> commandBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_760;
  undefined1 local_740 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> commandPool;
  undefined4 local_718 [2];
  VkBindSparseInfo bindSparseInfo;
  undefined1 local_6b0 [8];
  VkSparseBufferMemoryBindInfo sparseBufferBindInfo;
  undefined8 uStack_690;
  VkAllocationCallbacks *local_688;
  Move<vk::Handle<(vk::HandleType)7>_> local_670;
  value_type local_650;
  undefined1 local_640 [8];
  VkSparseMemoryBind sparseMemoryBind;
  deUint32 sparseBindNdx;
  string local_608;
  deUint32 local_5e8;
  uint local_5e4;
  deUint32 memoryType;
  deUint32 numSparseBinds;
  vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> sparseMemoryBinds;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  deviceMemUniquePtrVec;
  ulong local_450;
  undefined1 local_270 [8];
  VkMemoryRequirements bufferMemRequirement;
  RefData<vk::Handle<(vk::HandleType)4>_> local_238;
  undefined1 local_218 [8];
  Unique<vk::Handle<(vk::HandleType)4>_> bufferMemoryBindSemaphore;
  RefData<vk::Handle<(vk::HandleType)8>_> local_1d8;
  undefined1 local_1b8 [8];
  Unique<vk::Handle<(vk::HandleType)8>_> sparseBuffer;
  deUint32 queueFamilyIndices [2];
  VkBufferCreateInfo bufferCreateInfo;
  Queue *computeQueue;
  Queue *sparseQueue;
  DeviceInterface *deviceInterface;
  QueueRequirements local_138;
  undefined1 local_130 [8];
  QueueRequirementsVec queueRequirements;
  VkPhysicalDeviceFeatures local_104;
  VkPhysicalDevice local_28;
  VkPhysicalDevice physicalDevice;
  InstanceInterface *instance;
  BufferSparseBindingInstance *this_local;
  
  instance = (InstanceInterface *)this;
  this_local = (BufferSparseBindingInstance *)__return_storage_ptr__;
  physicalDevice =
       (VkPhysicalDevice)
       Context::getInstanceInterface
                 ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  local_28 = Context::getPhysicalDevice
                       ((this->super_SparseResourcesBaseInstance).super_TestInstance.m_context);
  ::vk::getPhysicalDeviceFeatures(&local_104,(InstanceInterface *)physicalDevice,local_28);
  if (local_104.sparseBinding == 0) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Sparse binding not supported",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
               ,0x68);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_> *)
         local_130);
  QueueRequirements::QueueRequirements(&local_138,8,1);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_130,&local_138);
  QueueRequirements::QueueRequirements((QueueRequirements *)&deviceInterface,2,1);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  push_back((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>
             *)local_130,(value_type *)&deviceInterface);
  SparseResourcesBaseInstance::createDeviceSupportingQueues
            (&this->super_SparseResourcesBaseInstance,(QueueRequirementsVec *)local_130);
  std::vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_>::
  ~vector((vector<vkt::sparse::QueueRequirements,_std::allocator<vkt::sparse::QueueRequirements>_> *
          )local_130);
  vk = (MovePtr *)
       SparseResourcesBaseInstance::getDeviceInterface(&this->super_SparseResourcesBaseInstance);
  pQVar7 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,8,0);
  pQVar8 = SparseResourcesBaseInstance::getQueue(&this->super_SparseResourcesBaseInstance,2,0);
  queueFamilyIndices[0] = 0xc;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._0_4_ =
       pQVar7->queueFamilyIndex;
  sparseBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator._4_4_ =
       pQVar8->queueFamilyIndex;
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  this_00 = &bufferMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter.
             m_allocator;
  ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)this_00,(DeviceInterface *)vk,pVVar9,
                     (VkBufferCreateInfo *)queueFamilyIndices,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_1d8,(Move *)this_00);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_1d8.deleter.m_deviceIface;
  data_01.object.m_internal = local_1d8.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1d8.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_1d8.deleter.m_device;
  data_01.deleter.m_allocator._0_4_ = (int)local_1d8.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_1d8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_1b8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)8>_> *)
             &bufferMemoryBindSemaphore.super_RefBase<vk::Handle<(vk::HandleType)4>_>.m_data.deleter
              .m_allocator);
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&bufferMemRequirement.memoryTypeBits,
             (DeviceInterface *)vk,pVVar9,0,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_238,(Move *)&bufferMemRequirement.memoryTypeBits);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_238.deleter.m_deviceIface;
  data_02.object.m_internal = local_238.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_238.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device = local_238.deleter.m_device;
  data_02.deleter.m_allocator._0_4_ = (int)local_238.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_238.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_218,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)4>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&bufferMemRequirement.memoryTypeBits);
  pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
  pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_1b8);
  ::vk::getBufferMemoryRequirements
            ((VkMemoryRequirements *)local_270,(DeviceInterface *)vk,pVVar9,
             (VkBuffer)pHVar10->m_internal);
  auVar5 = local_270;
  ::vk::getPhysicalDeviceProperties
            ((VkPhysicalDeviceProperties *)
             &deviceMemUniquePtrVec.
              super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(InstanceInterface *)physicalDevice
             ,local_28);
  if (local_450 < (ulong)auVar5) {
    pNVar11 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar11,"Required memory size for sparse resources exceeds device limits",(char *)0x0
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
               ,0x95);
    __cxa_throw(pNVar11,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
            *)&sparseMemoryBinds.
               super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::vector
            ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)&memoryType)
  ;
  local_5e4 = (uint)((ulong)local_270 / bufferMemRequirement.size);
  local_5e8 = findMatchingMemoryType
                        ((InstanceInterface *)physicalDevice,local_28,
                         (VkMemoryRequirements *)local_270,
                         (MemoryRequirement *)&::vk::MemoryRequirement::Any);
  if (local_5e8 == 0xffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_608,"No matching memory type found",
               (allocator<char> *)((long)&sparseBindNdx + 3));
    tcu::TestStatus::fail(__return_storage_ptr__,&local_608);
    std::__cxx11::string::~string((string *)&local_608);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sparseBindNdx + 3));
    bVar4 = true;
  }
  else {
    for (sparseMemoryBind._36_4_ = 0; (uint)sparseMemoryBind._36_4_ < local_5e4;
        sparseMemoryBind._36_4_ = sparseMemoryBind._36_4_ + 1) {
      pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      makeSparseMemoryBind
                ((VkSparseMemoryBind *)local_640,(DeviceInterface *)vk,pVVar9,
                 bufferMemRequirement.size,local_5e8,
                 bufferMemRequirement.size * (uint)sparseMemoryBind._36_4_);
      object = ::vk::refdetails::check<vk::Handle<(vk::HandleType)7>>
                         ((Handle<(vk::HandleType)7>)sparseMemoryBind.size);
      pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
      ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)7>_>::Deleter
                ((Deleter<vk::Handle<(vk::HandleType)7>_> *)&sparseBufferBindInfo.pBinds,
                 (DeviceInterface *)vk,pVVar9,(VkAllocationCallbacks *)0x0);
      deleter.m_device._0_4_ = (int)uStack_690;
      deleter.m_deviceIface = (DeviceInterface *)sparseBufferBindInfo.pBinds;
      deleter.m_device._4_4_ = (int)((ulong)uStack_690 >> 0x20);
      deleter.m_allocator = local_688;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>>::Move<vk::Handle<(vk::HandleType)7>>
                ((Move<vk::Handle<(vk::HandleType)7>> *)&local_670,object,deleter);
      makeVkSharedPtr<vk::Handle<(vk::HandleType)7>>((sparse *)&local_650,&local_670);
      std::
      vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
      ::push_back((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
                   *)&sparseMemoryBinds.
                      super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_650);
      de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>::~SharedPtr(&local_650)
      ;
      ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_670);
      std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::push_back
                ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                 &memoryType,(value_type *)local_640);
    }
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_1b8);
    bindCount = local_5e4;
    bindSparseInfo.pSignalSemaphores = (VkSemaphore *)pHVar10->m_internal;
    pBinds = std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::
             operator[]((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)
                        &memoryType,0);
    ::vk::makeSparseBufferMemoryBindInfo
              ((VkSparseBufferMemoryBindInfo *)local_6b0,(VkBuffer)bindSparseInfo.pSignalSemaphores,
               bindCount,pBinds);
    local_718[0] = 7;
    bindSparseInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    bindSparseInfo._4_4_ = 0;
    bindSparseInfo.pNext._0_4_ = 0;
    bindSparseInfo.waitSemaphoreCount = 0;
    bindSparseInfo._20_4_ = 0;
    bindSparseInfo.pWaitSemaphores._0_4_ = 1;
    bindSparseInfo._32_8_ = local_6b0;
    bindSparseInfo.pBufferBinds._0_4_ = 0;
    bindSparseInfo.imageOpaqueBindCount = 0;
    bindSparseInfo._52_4_ = 0;
    bindSparseInfo.pImageOpaqueBinds._0_4_ = 0;
    bindSparseInfo.imageBindCount = 0;
    bindSparseInfo._68_4_ = 0;
    bindSparseInfo.pImageBinds._0_4_ = 1;
    bindSparseInfo._80_8_ =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_218);
    pVVar3 = pQVar7->queueHandle;
    ::vk::Handle<(vk::HandleType)6>::Handle
              ((Handle<(vk::HandleType)6> *)
               &commandPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                m_allocator,0);
    result = (*(*(_func_int ***)vk)[0x11])(vk,pVVar3,1,local_718);
    ::vk::checkResult(result,
                      "deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/sparse_resources/vktSparseResourcesBufferSparseBinding.cpp"
                      ,0xbf);
    bVar4 = false;
  }
  std::vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>::~vector
            ((vector<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_> *)&memoryType)
  ;
  if (!bVar4) {
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                    &commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,
                    (DeviceInterface *)vk,pVVar9,pQVar8->queueFamilyIndex);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_760,
               (Move *)&commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    data_03.deleter.m_deviceIface._0_4_ = (int)local_760.deleter.m_deviceIface;
    data_03.object.m_internal = local_760.object.m_internal;
    data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_760.deleter.m_deviceIface >> 0x20);
    data_03.deleter.m_device = local_760.deleter.m_device;
    data_03.deleter.m_allocator._0_4_ = (int)local_760.deleter.m_allocator;
    data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_760.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_740,data_03);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)24>_> *)
               &commandBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pHVar12 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_740);
    ::vk::allocateCommandBuffer
              (&local_7e0,(DeviceInterface *)vk,pVVar9,(VkCommandPool)pHVar12->m_internal,
               VK_COMMAND_BUFFER_LEVEL_PRIMARY);
    ::vk::refdetails::Move::operator_cast_to_RefData(&local_7c0,(Move *)&local_7e0);
    data_04.deleter.m_deviceIface._0_4_ = (int)local_7c0.deleter.m_deviceIface;
    data_04.object = local_7c0.object;
    data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_7c0.deleter.m_deviceIface >> 0x20);
    data_04.deleter.m_device = local_7c0.deleter.m_device;
    data_04.deleter.m_pool.m_internal._0_4_ = (int)local_7c0.deleter.m_pool.m_internal;
    data_04.deleter.m_pool.m_internal._4_4_ = (int)(local_7c0.deleter.m_pool.m_internal >> 0x20);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_7a0,data_04);
    ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_7e0);
    ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7a0);
    beginCommandBuffer((DeviceInterface *)vk,*ppVVar13);
    makeBufferCreateInfo
              ((VkBufferCreateInfo *)
               &inputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator
               ,(ulong)this->m_bufferSize,1);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                       &inputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8,(DeviceInterface *)vk,pVVar9,
                       (VkBufferCreateInfo *)
                       &inputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_allocator,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_860,
               (Move *)&inputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    uVar20 = SUB84(local_860.deleter.m_deviceIface,0);
    uVar21 = (undefined4)((ulong)local_860.deleter.m_deviceIface >> 0x20);
    data_05.deleter.m_deviceIface._0_4_ = uVar20;
    data_05.object.m_internal = local_860.object.m_internal;
    data_05.deleter.m_deviceIface._4_4_ = uVar21;
    data_05.deleter.m_device = local_860.deleter.m_device;
    data_05.deleter.m_allocator._0_4_ = (int)local_860.deleter.m_allocator;
    data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_860.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_840,data_05);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &inputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar14 = SparseResourcesBaseInstance::getAllocator(&this->super_SparseResourcesBaseInstance);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_840);
    referenceData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
    pMVar19 = vk;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_8b0,
               (DeviceInterface *)vk,pVVar9,pAVar14,(VkBuffer)pHVar10->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_8a0 = de::details::MovePtr::operator_cast_to_PtrData(&local_8b0,pMVar19);
    data._8_4_ = uVar20;
    data.ptr = (Allocation *)local_860.object.m_internal;
    data._12_4_ = uVar21;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_890,data);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_8b0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8d8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8d8,
               (ulong)this->m_bufferSize);
    for (local_8dc = 0; local_8dc < this->m_bufferSize; local_8dc = local_8dc + 1) {
      uVar18 = (ulong)local_8dc % bufferMemRequirement.size;
      pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                          ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8d8,
                           (ulong)local_8dc);
      *pvVar15 = (char)uVar18 + '\x01';
    }
    pAVar16 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_890);
    dst = ::vk::Allocation::getHostPtr(pAVar16);
    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8d8,0);
    ::deMemcpy(dst,pvVar15,(ulong)this->m_bufferSize);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar16 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_890);
    inputBufferBarrier.size = (VkDeviceSize)::vk::Allocation::getMemory(pAVar16);
    pAVar16 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_890);
    VVar17 = ::vk::Allocation::getOffset(pAVar16);
    ::vk::flushMappedMemoryRange
              ((DeviceInterface *)vk,pVVar9,(VkDeviceMemory)inputBufferBarrier.size,VVar17,
               (ulong)this->m_bufferSize);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_840);
    bufferCopy.size = pHVar10->m_internal;
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_920,0x4000,0x800,(VkBuffer)bufferCopy.size,0,
               (ulong)this->m_bufferSize);
    ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7a0);
    (*(*(_func_int ***)vk)[0x6d])(vk,*ppVVar13,0x4000,0x1000,0,0,0,1,local_920,0,0);
    ::vk::makeBufferCopy((VkBufferCopy *)local_940,0,0,(ulong)this->m_bufferSize);
    ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7a0);
    pVVar1 = *ppVVar13;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_840);
    dVar2 = pHVar10->m_internal;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_1b8);
    sparseBufferBarrier.size = pHVar10->m_internal;
    (*(*(_func_int ***)vk)[0x5f])(vk,pVVar1,dVar2,sparseBufferBarrier.size,1,local_940);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_1b8);
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_988,0x1000,0x800,(VkBuffer)pHVar10->m_internal,0,
               (ulong)this->m_bufferSize);
    ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7a0);
    (*(*(_func_int ***)vk)[0x6d])(vk,*ppVVar13,0x1000,0x1000,0,0,0,1,local_988,0,0);
    makeBufferCreateInfo
              ((VkBufferCreateInfo *)
               &outputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                m_allocator,(ulong)this->m_bufferSize,2);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    ::vk::createBuffer((Move<vk::Handle<(vk::HandleType)8>_> *)
                       &outputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8,(DeviceInterface *)vk,pVVar9,
                       (VkBufferCreateInfo *)
                       &outputBuffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.
                        m_allocator,(VkAllocationCallbacks *)0x0);
    ::vk::refdetails::Move::operator_cast_to_RefData
              (&local_a08,
               (Move *)&outputBufferAlloc.
                        super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
                        .field_0x8);
    uVar20 = SUB84(local_a08.deleter.m_deviceIface,0);
    uVar21 = (undefined4)((ulong)local_a08.deleter.m_deviceIface >> 0x20);
    data_06.deleter.m_deviceIface._0_4_ = uVar20;
    data_06.object.m_internal = local_a08.object.m_internal;
    data_06.deleter.m_deviceIface._4_4_ = uVar21;
    data_06.deleter.m_device = local_a08.deleter.m_device;
    data_06.deleter.m_allocator._0_4_ = (int)local_a08.deleter.m_allocator;
    data_06.deleter.m_allocator._4_4_ = (int)((ulong)local_a08.deleter.m_allocator >> 0x20);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_9e8,data_06);
    ::vk::refdetails::Move<vk::Handle<(vk::HandleType)8>_>::~Move
              ((Move<vk::Handle<(vk::HandleType)8>_> *)
               &outputBufferAlloc.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
                field_0x8);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar14 = SparseResourcesBaseInstance::getAllocator(&this->super_SparseResourcesBaseInstance);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_9e8);
    bufferCopy_1.size._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
    pMVar19 = vk;
    bindBuffer((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a58,
               (DeviceInterface *)vk,pVVar9,pAVar14,(VkBuffer)pHVar10->m_internal,
               ::vk::MemoryRequirement::HostVisible);
    local_a48 = de::details::MovePtr::operator_cast_to_PtrData(&local_a58,pMVar19);
    data_00._8_4_ = uVar20;
    data_00.ptr = (Allocation *)local_a08.object.m_internal;
    data_00._12_4_ = uVar21;
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a38,data_00);
    de::details::MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~MovePtr
              ((MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)&local_a58);
    ::vk::makeBufferCopy((VkBufferCopy *)local_a80,0,0,(ulong)this->m_bufferSize);
    ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7a0);
    pVVar1 = *ppVVar13;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_1b8);
    dVar2 = pHVar10->m_internal;
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_9e8);
    outputBufferBarrier.size = pHVar10->m_internal;
    (*(*(_func_int ***)vk)[0x5f])(vk,pVVar1,dVar2,outputBufferBarrier.size,1,local_a80);
    pHVar10 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)8>_>::operator*
                        ((RefBase<vk::Handle<(vk::HandleType)8>_> *)local_9e8);
    VStack_ad0.m_internal = pHVar10->m_internal;
    makeBufferMemoryBarrier
              ((VkBufferMemoryBarrier *)local_ac8,0x1000,0x2000,VStack_ad0,0,
               (ulong)this->m_bufferSize);
    ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7a0);
    (*(*(_func_int ***)vk)[0x6d])(vk,*ppVVar13,0x1000,0x4000,0,0,0,1,local_ac8,0,0);
    ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7a0);
    endCommandBuffer((DeviceInterface *)vk,*ppVVar13);
    local_ad4 = 0x1000;
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pVVar3 = pQVar8->queueHandle;
    ppVVar13 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         ((RefBase<vk::VkCommandBuffer_s_*> *)local_7a0);
    commandBuffer_00 = *ppVVar13;
    pWaitSemaphores =
         ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)4>_>::get
                   ((RefBase<vk::Handle<(vk::HandleType)4>_> *)local_218);
    submitCommandsAndWait
              ((DeviceInterface *)vk,pVVar9,pVVar3,commandBuffer_00,1,pWaitSemaphores,&local_ad4,0,
               (VkSemaphore *)0x0);
    pVVar9 = SparseResourcesBaseInstance::getDevice(&this->super_SparseResourcesBaseInstance);
    pAVar16 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_a38);
    outputData = (deUint8 *)::vk::Allocation::getMemory(pAVar16);
    pAVar16 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_a38);
    VVar17 = ::vk::Allocation::getOffset(pAVar16);
    ::vk::invalidateMappedMemoryRange
              ((DeviceInterface *)vk,pVVar9,(VkDeviceMemory)outputData,VVar17,
               (ulong)this->m_bufferSize);
    pAVar16 = de::details::UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::
              operator->((UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)
                         local_a38);
    local_ae8 = ::vk::Allocation::getHostPtr(pAVar16);
    (*(*(_func_int ***)vk)[3])(vk,pQVar7->queueHandle);
    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8d8,0);
    iVar6 = deMemCmp(pvVar15,local_ae8,(ulong)this->m_bufferSize);
    if (iVar6 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b30,"Passed",&local_b31);
      tcu::TestStatus::pass(__return_storage_ptr__,&local_b30);
      std::__cxx11::string::~string((string *)&local_b30);
      std::allocator<char>::~allocator(&local_b31);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_b08,"Failed",&local_b09);
      tcu::TestStatus::fail(__return_storage_ptr__,&local_b08);
      std::__cxx11::string::~string((string *)&local_b08);
      std::allocator<char>::~allocator(&local_b09);
    }
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_a38);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_9e8);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_8d8);
    de::details::UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>::~UniquePtr
              ((UniquePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> *)local_890);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_840);
    ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
              ((Unique<vk::VkCommandBuffer_s_*> *)local_7a0);
    ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
              ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_740);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
  ::~vector((vector<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>_>_>_>
             *)&sparseMemoryBinds.
                super__Vector_base<vk::VkSparseMemoryBind,_std::allocator<vk::VkSparseMemoryBind>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)4>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)4>_> *)local_218);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)8>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)8>_> *)local_1b8);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus BufferSparseBindingInstance::iterate (void)
{
	const InstanceInterface&	instance		= m_context.getInstanceInterface();
	const VkPhysicalDevice		physicalDevice	= m_context.getPhysicalDevice();

	if (!getPhysicalDeviceFeatures(instance, physicalDevice).sparseBinding)
		TCU_THROW(NotSupportedError, "Sparse binding not supported");

	{
		// Create logical device supporting both sparse and compute operations
		QueueRequirementsVec queueRequirements;
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_SPARSE_BINDING_BIT, 1u));
		queueRequirements.push_back(QueueRequirements(VK_QUEUE_COMPUTE_BIT, 1u));

		createDeviceSupportingQueues(queueRequirements);
	}

	const DeviceInterface&	deviceInterface	= getDeviceInterface();
	const Queue&			sparseQueue		= getQueue(VK_QUEUE_SPARSE_BINDING_BIT, 0);
	const Queue&			computeQueue	= getQueue(VK_QUEUE_COMPUTE_BIT, 0);

	VkBufferCreateInfo bufferCreateInfo;

	bufferCreateInfo.sType					= VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;	// VkStructureType		sType;
	bufferCreateInfo.pNext					= DE_NULL;								// const void*			pNext;
	bufferCreateInfo.flags					= VK_BUFFER_CREATE_SPARSE_BINDING_BIT;	// VkBufferCreateFlags	flags;
	bufferCreateInfo.size					= m_bufferSize;							// VkDeviceSize			size;
	bufferCreateInfo.usage					= VK_BUFFER_USAGE_TRANSFER_SRC_BIT |
											  VK_BUFFER_USAGE_TRANSFER_DST_BIT;		// VkBufferUsageFlags	usage;
	bufferCreateInfo.sharingMode			= VK_SHARING_MODE_EXCLUSIVE;			// VkSharingMode		sharingMode;
	bufferCreateInfo.queueFamilyIndexCount	= 0u;									// deUint32				queueFamilyIndexCount;
	bufferCreateInfo.pQueueFamilyIndices	= DE_NULL;								// const deUint32*		pQueueFamilyIndices;

	const deUint32 queueFamilyIndices[] = { sparseQueue.queueFamilyIndex, computeQueue.queueFamilyIndex };

	if (sparseQueue.queueFamilyIndex != computeQueue.queueFamilyIndex)
	{
		bufferCreateInfo.sharingMode			= VK_SHARING_MODE_CONCURRENT;	// VkSharingMode		sharingMode;
		bufferCreateInfo.queueFamilyIndexCount	= 2u;							// deUint32				queueFamilyIndexCount;
		bufferCreateInfo.pQueueFamilyIndices	= queueFamilyIndices;			// const deUint32*		pQueueFamilyIndices;
	}

	// Create sparse buffer
	const Unique<VkBuffer> sparseBuffer(createBuffer(deviceInterface, getDevice(), &bufferCreateInfo));

	// Create sparse buffer memory bind semaphore
	const Unique<VkSemaphore> bufferMemoryBindSemaphore(createSemaphore(deviceInterface, getDevice()));

	const VkMemoryRequirements bufferMemRequirement = getBufferMemoryRequirements(deviceInterface, getDevice(), *sparseBuffer);

	if (bufferMemRequirement.size > getPhysicalDeviceProperties(instance, physicalDevice).limits.sparseAddressSpaceSize)
		TCU_THROW(NotSupportedError, "Required memory size for sparse resources exceeds device limits");

	DE_ASSERT((bufferMemRequirement.size % bufferMemRequirement.alignment) == 0);

	std::vector<DeviceMemorySp> deviceMemUniquePtrVec;

	{
		std::vector<VkSparseMemoryBind>	sparseMemoryBinds;
		const deUint32					numSparseBinds = static_cast<deUint32>(bufferMemRequirement.size / bufferMemRequirement.alignment);
		const deUint32					memoryType = findMatchingMemoryType(instance, physicalDevice, bufferMemRequirement, MemoryRequirement::Any);

		if (memoryType == NO_MATCH_FOUND)
			return tcu::TestStatus::fail("No matching memory type found");

		for (deUint32 sparseBindNdx = 0; sparseBindNdx < numSparseBinds; ++sparseBindNdx)
		{
			const VkSparseMemoryBind sparseMemoryBind = makeSparseMemoryBind(deviceInterface, getDevice(), bufferMemRequirement.alignment, memoryType, bufferMemRequirement.alignment * sparseBindNdx);

			deviceMemUniquePtrVec.push_back(makeVkSharedPtr(Move<VkDeviceMemory>(check<VkDeviceMemory>(sparseMemoryBind.memory), Deleter<VkDeviceMemory>(deviceInterface, getDevice(), DE_NULL))));

			sparseMemoryBinds.push_back(sparseMemoryBind);
		}

		const VkSparseBufferMemoryBindInfo sparseBufferBindInfo = makeSparseBufferMemoryBindInfo(*sparseBuffer, numSparseBinds, &sparseMemoryBinds[0]);

		const VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			1u,											//deUint32									bufferBindCount;
			&sparseBufferBindInfo,						//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&bufferMemoryBindSemaphore.get()			//const VkSemaphore*						pSignalSemaphores;
		};

		// Submit sparse bind commands for execution
		VK_CHECK(deviceInterface.queueBindSparse(sparseQueue.queueHandle, 1u, &bindSparseInfo, DE_NULL));
	}

	// Create command buffer for transfer oparations
	const Unique<VkCommandPool>		commandPool(makeCommandPool(deviceInterface, getDevice(), computeQueue.queueFamilyIndex));
	const Unique<VkCommandBuffer>	commandBuffer(allocateCommandBuffer(deviceInterface, getDevice(), *commandPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording transfer commands
	beginCommandBuffer(deviceInterface, *commandBuffer);

	const VkBufferCreateInfo		inputBufferCreateInfo = makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	const Unique<VkBuffer>			inputBuffer				(createBuffer(deviceInterface, getDevice(), &inputBufferCreateInfo));
	const de::UniquePtr<Allocation>	inputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *inputBuffer, MemoryRequirement::HostVisible));

	std::vector<deUint8> referenceData;
	referenceData.resize(m_bufferSize);

	for (deUint32 valueNdx = 0; valueNdx < m_bufferSize; ++valueNdx)
	{
		referenceData[valueNdx] = static_cast<deUint8>((valueNdx % bufferMemRequirement.alignment) + 1u);
	}

	deMemcpy(inputBufferAlloc->getHostPtr(), &referenceData[0], m_bufferSize);

	flushMappedMemoryRange(deviceInterface, getDevice(), inputBufferAlloc->getMemory(), inputBufferAlloc->getOffset(), m_bufferSize);

	{
		const VkBufferMemoryBarrier inputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_HOST_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*inputBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &inputBufferBarrier, 0u, DE_NULL);
	}

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *inputBuffer, *sparseBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier sparseBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_TRANSFER_READ_BIT,
										*sparseBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u, 0u, DE_NULL, 1u, &sparseBufferBarrier, 0u, DE_NULL);
	}

	const VkBufferCreateInfo		outputBufferCreateInfo	= makeBufferCreateInfo(m_bufferSize, VK_BUFFER_USAGE_TRANSFER_DST_BIT);
	const Unique<VkBuffer>			outputBuffer			(createBuffer(deviceInterface, getDevice(), &outputBufferCreateInfo));
	const de::UniquePtr<Allocation>	outputBufferAlloc		(bindBuffer(deviceInterface, getDevice(), getAllocator(), *outputBuffer, MemoryRequirement::HostVisible));

	{
		const VkBufferCopy bufferCopy = makeBufferCopy(0u, 0u, m_bufferSize);

		deviceInterface.cmdCopyBuffer(*commandBuffer, *sparseBuffer, *outputBuffer, 1u, &bufferCopy);
	}

	{
		const VkBufferMemoryBarrier outputBufferBarrier
			= makeBufferMemoryBarrier(	VK_ACCESS_TRANSFER_WRITE_BIT,
										VK_ACCESS_HOST_READ_BIT,
										*outputBuffer,
										0u,
										m_bufferSize);

		deviceInterface.cmdPipelineBarrier(*commandBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u, 0u, DE_NULL, 1u, &outputBufferBarrier, 0u, DE_NULL);
	}

	// End recording transfer commands
	endCommandBuffer(deviceInterface, *commandBuffer);

	const VkPipelineStageFlags waitStageBits[] = { VK_PIPELINE_STAGE_TRANSFER_BIT };

	// Submit transfer commands for execution and wait for completion
	submitCommandsAndWait(deviceInterface, getDevice(), computeQueue.queueHandle, *commandBuffer, 1u, &bufferMemoryBindSemaphore.get(), waitStageBits);

	// Retrieve data from output buffer to host memory
	invalidateMappedMemoryRange(deviceInterface, getDevice(), outputBufferAlloc->getMemory(), outputBufferAlloc->getOffset(), m_bufferSize);

	const deUint8* outputData = static_cast<const deUint8*>(outputBufferAlloc->getHostPtr());

	// Wait for sparse queue to become idle
	deviceInterface.queueWaitIdle(sparseQueue.queueHandle);

	// Compare output data with reference data
	if (deMemCmp(&referenceData[0], outputData, m_bufferSize) != 0)
		return tcu::TestStatus::fail("Failed");
	else
		return tcu::TestStatus::pass("Passed");
}